

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

void cmSourceFileSetName(void *arg,char *name,char *dir,int numSourceExtensions,
                        char **sourceExtensions,int numHeaderExtensions,char **headerExtensions)

{
  string *this;
  char *pcVar1;
  pointer pbVar2;
  bool bVar3;
  long lVar4;
  ostream *poVar5;
  ulong uVar6;
  pointer pbVar7;
  string *ext;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string hname;
  string pathname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headerExts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sourceExts;
  ostringstream e;
  string local_278;
  string local_258;
  string local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  size_type local_188;
  pointer local_180;
  ios_base local_138 [264];
  
  if (*arg == 0) {
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (0 < numSourceExtensions) {
      uVar6 = (ulong)(uint)numSourceExtensions;
      do {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1e8,
                   sourceExtensions);
        sourceExtensions = sourceExtensions + 1;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    if (0 < numHeaderExtensions) {
      uVar6 = (ulong)(uint)numHeaderExtensions;
      do {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_208,
                   headerExtensions);
        headerExtensions = headerExtensions + 1;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    this = (string *)((long)arg + 8);
    pcVar1 = *(char **)((long)arg + 0x10);
    strlen(name);
    std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,(ulong)name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,name,(allocator<char> *)&local_258);
    cmsys::SystemTools::CollapseFullPath(&local_228,(string *)local_1a8,dir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != &local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
    }
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_278,local_228._M_dataplus._M_p,
               (char *)(local_228._M_string_length + (long)local_228._M_dataplus._M_p));
    bVar3 = cmsys::SystemTools::FileExists(&local_278);
    pbVar2 = local_1e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,name,(allocator<char> *)&local_1c8);
      cmsys::SystemTools::GetFilenamePath((string *)local_1a8,&local_258);
      std::__cxx11::string::operator=(this,(string *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,
                        CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                 local_258.field_2._M_local_buf[0]) + 1);
      }
      if (*(long *)((long)arg + 0x10) != 0) {
        std::__cxx11::string::append((char *)this);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,name,(allocator<char> *)&local_1c8);
      cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)local_1a8,&local_258);
      std::__cxx11::string::_M_append((char *)this,local_1a8._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,
                        CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                 local_258.field_2._M_local_buf[0]) + 1);
      }
      lVar4 = std::__cxx11::string::rfind((char)&local_278,0x2e);
      if (lVar4 != -1) {
        std::__cxx11::string::substr((ulong)local_1a8,(ulong)&local_278);
        std::__cxx11::string::operator=((string *)((long)arg + 0x28),(string *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
        }
        bVar3 = cmsys::SystemTools::FileIsFullPath(name);
        if (bVar3) {
          lVar4 = std::__cxx11::string::rfind((char)&local_278,0x2f);
          if (lVar4 != -1) {
            std::__cxx11::string::substr((ulong)local_1a8,(ulong)&local_278);
            std::__cxx11::string::operator=(this,(string *)local_1a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._0_8_ != &local_198) {
              operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
            }
          }
        }
      }
      std::__cxx11::string::_M_assign((string *)((long)arg + 0x48));
    }
    else {
      if (local_1e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar7 = local_1e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_258._M_dataplus._M_p = (pointer)0x1;
          local_258.field_2._M_local_buf[0] = '.';
          local_1a8._0_8_ = local_228._M_string_length;
          local_1a8._8_8_ = local_228._M_dataplus._M_p;
          local_198._M_allocated_capacity = 1;
          local_180 = (pbVar7->_M_dataplus)._M_p;
          local_188 = pbVar7->_M_string_length;
          views._M_len = 3;
          views._M_array = (iterator)local_1a8;
          local_258._M_string_length = (size_type)&local_258.field_2;
          local_198._8_8_ = &local_258.field_2;
          cmCatViews_abi_cxx11_(&local_1c8,views);
          std::__cxx11::string::operator=((string *)&local_278,(string *)&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          bVar3 = cmsys::SystemTools::FileExists(&local_278);
          if (bVar3) {
            std::__cxx11::string::_M_assign((string *)((long)arg + 0x28));
            std::__cxx11::string::_M_assign((string *)((long)arg + 0x48));
            goto LAB_002ba37d;
          }
          pbVar7 = pbVar7 + 1;
        } while (pbVar7 != pbVar2);
      }
      pbVar2 = local_208.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar7 = local_208.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_258._M_dataplus._M_p = (pointer)0x1;
          local_258.field_2._M_local_buf[0] = '.';
          local_1a8._0_8_ = local_228._M_string_length;
          local_1a8._8_8_ = local_228._M_dataplus._M_p;
          local_198._M_allocated_capacity = 1;
          local_180 = (pbVar7->_M_dataplus)._M_p;
          local_188 = pbVar7->_M_string_length;
          views_00._M_len = 3;
          views_00._M_array = (iterator)local_1a8;
          local_258._M_string_length = (size_type)&local_258.field_2;
          local_198._8_8_ = &local_258.field_2;
          cmCatViews_abi_cxx11_(&local_1c8,views_00);
          std::__cxx11::string::operator=((string *)&local_278,(string *)&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          bVar3 = cmsys::SystemTools::FileExists(&local_278);
          if (bVar3) {
            std::__cxx11::string::_M_assign((string *)((long)arg + 0x28));
            std::__cxx11::string::_M_assign((string *)((long)arg + 0x48));
            goto LAB_002ba37d;
          }
          pbVar7 = pbVar7 + 1;
        } while (pbVar7 != pbVar2);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Cannot find source file \"",0x19);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\n\nTried extensions",0x12);
      pbVar2 = local_1e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_1e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar7 = local_1e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," .",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
          pbVar7 = pbVar7 + 1;
        } while (pbVar7 != pbVar2);
      }
      pbVar2 = local_208.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar7 = local_208.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," .",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
          pbVar7 = pbVar7 + 1;
        } while (pbVar7 != pbVar2);
      }
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,
                        CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                 local_258.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
LAB_002ba37d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_208);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1e8);
  }
  return;
}

Assistant:

static void CCONV cmSourceFileSetName(void* arg, const char* name,
                                      const char* dir, int numSourceExtensions,
                                      const char** sourceExtensions,
                                      int numHeaderExtensions,
                                      const char** headerExtensions)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (sf->RealSourceFile) {
    // SetName is allowed only on temporary source files created by
    // the command for building and passing to AddSource.
    return;
  }
  std::vector<std::string> sourceExts;
  std::vector<std::string> headerExts;
  int i;
  for (i = 0; i < numSourceExtensions; ++i) {
    sourceExts.emplace_back(sourceExtensions[i]);
  }
  for (i = 0; i < numHeaderExtensions; ++i) {
    headerExts.emplace_back(headerExtensions[i]);
  }

  // Save the original name given.
  sf->SourceName = name;

  // Convert the name to a full path in case the given name is a
  // relative path.
  std::string pathname = cmSystemTools::CollapseFullPath(name, dir);

  // First try and see whether the listed file can be found
  // as is without extensions added on.
  std::string hname = pathname;
  if (cmSystemTools::FileExists(hname)) {
    sf->SourceName = cmSystemTools::GetFilenamePath(name);
    if (!sf->SourceName.empty()) {
      sf->SourceName += "/";
    }
    sf->SourceName += cmSystemTools::GetFilenameWithoutLastExtension(name);
    std::string::size_type pos = hname.rfind('.');
    if (pos != std::string::npos) {
      sf->SourceExtension = hname.substr(pos + 1, hname.size() - pos);
      if (cmSystemTools::FileIsFullPath(name)) {
        std::string::size_type pos2 = hname.rfind('/');
        if (pos2 != std::string::npos) {
          sf->SourceName = hname.substr(pos2 + 1, pos - pos2 - 1);
        }
      }
    }

    sf->FullPath = hname;
    return;
  }

  // Next, try the various source extensions
  for (std::string const& ext : sourceExts) {
    hname = cmStrCat(pathname, '.', ext);
    if (cmSystemTools::FileExists(hname)) {
      sf->SourceExtension = ext;
      sf->FullPath = hname;
      return;
    }
  }

  // Finally, try the various header extensions
  for (std::string const& ext : headerExts) {
    hname = cmStrCat(pathname, '.', ext);
    if (cmSystemTools::FileExists(hname)) {
      sf->SourceExtension = ext;
      sf->FullPath = hname;
      return;
    }
  }

  std::ostringstream e;
  e << "Cannot find source file \"" << pathname << "\"";
  e << "\n\nTried extensions";
  for (std::string const& ext : sourceExts) {
    e << " ." << ext;
  }
  for (std::string const& ext : headerExts) {
    e << " ." << ext;
  }
  cmSystemTools::Error(e.str());
}